

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveElement
          (ON_SerialNumberMap *this,SN_ELEMENT *e,bool bRemoveFromHashBlock)

{
  SN_ELEMENT *pSVar1;
  uint uVar2;
  SN_ELEMENT *pSVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  if ((e == (SN_ELEMENT *)0x0) || (e->m_id_active == '\0')) {
    e = (SN_ELEMENT *)0x0;
  }
  else {
    e->m_id_active = '\0';
    if (this->m_active_id_count == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                 ,0x444,"","ON_SerialNumberMap - m_active_id_count corruption");
      uVar4 = 0;
      uVar5._0_2_ = 0;
      uVar5._2_2_ = 0;
      uVar6._0_1_ = '\0';
      uVar6._1_1_ = '\0';
      uVar6._2_1_ = '\0';
      uVar6._3_1_ = '\0';
      uVar7._0_1_ = '\0';
      uVar7._1_1_ = '\0';
      uVar7._2_1_ = '\0';
      uVar7._3_1_ = '\0';
    }
    else {
      this->m_active_id_count = this->m_active_id_count - 1;
      uVar4 = (e->m_id).Data1;
      uVar5._0_2_ = (e->m_id).Data2;
      uVar5._2_2_ = (e->m_id).Data3;
      uVar6 = *(undefined4 *)(e->m_id).Data4;
      uVar7 = *(undefined4 *)((e->m_id).Data4 + 4);
    }
    (this->m_inactive_id).Data1 = uVar4;
    (this->m_inactive_id).Data2 = (unsigned_short)uVar5;
    (this->m_inactive_id).Data3 = SUB42(uVar5,2);
    *(undefined4 *)(this->m_inactive_id).Data4 = uVar6;
    *(undefined4 *)((this->m_inactive_id).Data4 + 4) = uVar7;
    if (bRemoveFromHashBlock && this->m_bHashTableIsValid != '\0') {
      uVar4 = e->m_id_crc32;
      uVar2 = uVar4 / 0xffa + (uVar4 / 0xff4024) * -0xffa;
      pSVar1 = this->m_hash_table_blocks[(ulong)uVar4 % (ulong)this->m_hash_block_count][uVar2];
      if (pSVar1 == (SN_ELEMENT *)0x0) {
LAB_004d5e88:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                   ,0x45d,"","id not found in hash table.");
      }
      else {
        if (pSVar1 == e) {
          pSVar3 = (SN_ELEMENT *)0x0;
        }
        else {
          do {
            pSVar3 = pSVar1;
            pSVar1 = pSVar3->m_next;
            if (pSVar1 == (SN_ELEMENT *)0x0) goto LAB_004d5e88;
          } while (pSVar1 != e);
        }
        if (pSVar3 == (SN_ELEMENT *)0x0) {
          this->m_hash_table_blocks[(ulong)uVar4 % (ulong)this->m_hash_block_count][uVar2] =
               pSVar1->m_next;
        }
        else {
          pSVar3->m_next = pSVar1->m_next;
        }
      }
    }
    e->m_next = (SN_ELEMENT *)0x0;
  }
  return e;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::Internal_HashTableRemoveElement(
  struct SN_ELEMENT* e,
  bool bRemoveFromHashBlock
  )
{
  if ( nullptr == e || 0 == e->m_id_active )
    return nullptr;

  e->m_id_active = 0;
  if ( m_active_id_count > 0 )
  {
    m_active_id_count--;
    // save this id.  When objects are replaced, this id will
    // be added back and saving it in m_inactive_id will 
    // prevent having to check for it in the hash table.
    m_inactive_id = e->m_id;
  }
  else
  {
    ON_ERROR("ON_SerialNumberMap - m_active_id_count corruption");
    m_inactive_id = ON_nil_uuid;
  }

  if ( m_bHashTableIsValid && bRemoveFromHashBlock )
  {
    // Hash table is valid - remove the element from the table
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
    struct SN_ELEMENT* prev = nullptr;
    struct SN_ELEMENT* h;
    for ( h = hash_table_block[hash_i]; h; h = h->m_next )
    {
      if (h == e)
      {
        if ( prev )
          prev->m_next = h->m_next;
        else
          hash_table_block[hash_i] = h->m_next;
        break;
      }
      prev = h;
    }
    if (nullptr == h)
    {
      ON_ERROR("id not found in hash table.");
    }
  }

  e->m_next = nullptr;
  return e;
}